

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O1

void mbedtls_sha256_process(mbedtls_sha256_context *ctx,uchar *data)

{
  uint uVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  uint auStack_158 [8];
  uint auStack_138 [66];
  
  local_178 = *(undefined8 *)ctx->state;
  uStack_170 = *(undefined8 *)(ctx->state + 2);
  local_168 = *(undefined8 *)(ctx->state + 4);
  uVar3 = *(undefined8 *)(ctx->state + 6);
  uStack_160 = uVar3;
  lVar4 = 0;
  do {
    uVar8 = *(uint *)(data + lVar4 * 4);
    auStack_158[lVar4 + 8] =
         uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  uStack_160._4_4_ = (uint)((ulong)uVar3 >> 0x20);
  uStack_160._0_4_ = (uint)uVar3;
  local_168._4_4_ = (uint)((ulong)local_168 >> 0x20);
  local_178._4_4_ = (uint)((ulong)local_178 >> 0x20);
  lVar4 = 7;
  uStack_170._4_4_ = (uint)((ulong)uStack_170 >> 0x20);
  do {
    iVar5 = (((uint)local_168 << 7 | (uint)local_168 >> 0x19) ^
            ((uint)local_168 << 0x15 | (uint)local_168 >> 0xb) ^
            ((uint)local_168 << 0x1a | (uint)local_168 >> 6)) + uStack_160._4_4_ +
            *(int *)(&UNK_001563c4 + lVar4 * 4) + auStack_158[lVar4 + 1] +
            ((local_168._4_4_ ^ (uint)uStack_160) & (uint)local_168 ^ (uint)uStack_160);
    uStack_170._4_4_ = uStack_170._4_4_ + iVar5;
    uStack_160._4_4_ =
         ((local_178._4_4_ | (uint)local_178) & (uint)uStack_170 | local_178._4_4_ & (uint)local_178
         ) + (((uint)local_178 << 10 | (uint)local_178 >> 0x16) ^
             ((uint)local_178 << 0x13 | (uint)local_178 >> 0xd) ^
             ((uint)local_178 << 0x1e | (uint)local_178 >> 2)) + iVar5;
    iVar5 = ((local_168._4_4_ ^ (uint)local_168) & uStack_170._4_4_ ^ local_168._4_4_) +
            (uint)uStack_160 + *(int *)(&UNK_001563c8 + lVar4 * 4) +
            ((uStack_170._4_4_ * 0x80 | uStack_170._4_4_ >> 0x19) ^
            (uStack_170._4_4_ * 0x200000 | uStack_170._4_4_ >> 0xb) ^
            (uStack_170._4_4_ * 0x4000000 | uStack_170._4_4_ >> 6)) + auStack_158[lVar4 + 2];
    uStack_170._0_4_ = (uint)uStack_170 + iVar5;
    uStack_160._0_4_ =
         ((uStack_160._4_4_ | (uint)local_178) & local_178._4_4_ |
         uStack_160._4_4_ & (uint)local_178) +
         ((uStack_160._4_4_ * 0x400 | uStack_160._4_4_ >> 0x16) ^
         (uStack_160._4_4_ * 0x80000 | uStack_160._4_4_ >> 0xd) ^
         (uStack_160._4_4_ * 0x40000000 | uStack_160._4_4_ >> 2)) + iVar5;
    iVar5 = local_168._4_4_ + *(int *)(&UNK_001563cc + lVar4 * 4) + auStack_158[lVar4 + 3] +
            ((uStack_170._4_4_ ^ (uint)local_168) & (uint)uStack_170 ^ (uint)local_168) +
            (((uint)uStack_170 * 0x80 | (uint)uStack_170 >> 0x19) ^
            ((uint)uStack_170 * 0x200000 | (uint)uStack_170 >> 0xb) ^
            ((uint)uStack_170 * 0x4000000 | (uint)uStack_170 >> 6));
    local_178._4_4_ = local_178._4_4_ + iVar5;
    local_168._4_4_ =
         iVar5 + (((uint)uStack_160 | uStack_160._4_4_) & (uint)local_178 |
                 (uint)uStack_160 & uStack_160._4_4_) +
                 (((uint)uStack_160 * 0x400 | (uint)uStack_160 >> 0x16) ^
                 ((uint)uStack_160 * 0x80000 | (uint)uStack_160 >> 0xd) ^
                 ((uint)uStack_160 * 0x40000000 | (uint)uStack_160 >> 2));
    iVar5 = (uint)local_168 + *(int *)(&DAT_001563d0 + lVar4 * 4) + auStack_158[lVar4 + 4] +
            (((uint)uStack_170 ^ uStack_170._4_4_) & local_178._4_4_ ^ uStack_170._4_4_) +
            ((local_178._4_4_ * 0x80 | local_178._4_4_ >> 0x19) ^
            (local_178._4_4_ * 0x200000 | local_178._4_4_ >> 0xb) ^
            (local_178._4_4_ * 0x4000000 | local_178._4_4_ >> 6));
    local_178._0_4_ = (uint)local_178 + iVar5;
    local_168._0_4_ =
         iVar5 + ((local_168._4_4_ | (uint)uStack_160) & uStack_160._4_4_ |
                 local_168._4_4_ & (uint)uStack_160) +
                 ((local_168._4_4_ * 0x400 | local_168._4_4_ >> 0x16) ^
                 (local_168._4_4_ * 0x80000 | local_168._4_4_ >> 0xd) ^
                 (local_168._4_4_ * 0x40000000 | local_168._4_4_ >> 2));
    iVar5 = uStack_170._4_4_ + *(int *)(&UNK_001563d4 + lVar4 * 4) + auStack_158[lVar4 + 5] +
            ((local_178._4_4_ ^ (uint)uStack_170) & (uint)local_178 ^ (uint)uStack_170) +
            (((uint)local_178 * 0x80 | (uint)local_178 >> 0x19) ^
            ((uint)local_178 * 0x200000 | (uint)local_178 >> 0xb) ^
            ((uint)local_178 * 0x4000000 | (uint)local_178 >> 6));
    uStack_160._4_4_ = uStack_160._4_4_ + iVar5;
    uStack_170._4_4_ =
         (((uint)local_168 | local_168._4_4_) & (uint)uStack_160 | (uint)local_168 & local_168._4_4_
         ) + (((uint)local_168 * 0x400 | (uint)local_168 >> 0x16) ^
             ((uint)local_168 * 0x80000 | (uint)local_168 >> 0xd) ^
             ((uint)local_168 * 0x40000000 | (uint)local_168 >> 2)) + iVar5;
    iVar5 = (uint)uStack_170 + *(int *)(&UNK_001563d8 + lVar4 * 4) + auStack_158[lVar4 + 6] +
            (((uint)local_178 ^ local_178._4_4_) & uStack_160._4_4_ ^ local_178._4_4_) +
            ((uStack_160._4_4_ * 0x80 | uStack_160._4_4_ >> 0x19) ^
            (uStack_160._4_4_ * 0x200000 | uStack_160._4_4_ >> 0xb) ^
            (uStack_160._4_4_ * 0x4000000 | uStack_160._4_4_ >> 6));
    uStack_160._0_4_ = (uint)uStack_160 + iVar5;
    uStack_170._0_4_ =
         ((uStack_170._4_4_ | (uint)local_168) & local_168._4_4_ |
         uStack_170._4_4_ & (uint)local_168) +
         ((uStack_170._4_4_ * 0x400 | uStack_170._4_4_ >> 0x16) ^
         (uStack_170._4_4_ * 0x80000 | uStack_170._4_4_ >> 0xd) ^
         (uStack_170._4_4_ * 0x40000000 | uStack_170._4_4_ >> 2)) + iVar5;
    iVar5 = local_178._4_4_ + *(int *)(&UNK_001563dc + lVar4 * 4) + auStack_158[lVar4 + 7] +
            ((uStack_160._4_4_ ^ (uint)local_178) & (uint)uStack_160 ^ (uint)local_178) +
            (((uint)uStack_160 * 0x80 | (uint)uStack_160 >> 0x19) ^
            ((uint)uStack_160 * 0x200000 | (uint)uStack_160 >> 0xb) ^
            ((uint)uStack_160 * 0x4000000 | (uint)uStack_160 >> 6));
    local_168._4_4_ = local_168._4_4_ + iVar5;
    local_178._4_4_ =
         (((uint)uStack_170 | uStack_170._4_4_) & (uint)local_168 |
         (uint)uStack_170 & uStack_170._4_4_) +
         (((uint)uStack_170 * 0x400 | (uint)uStack_170 >> 0x16) ^
         ((uint)uStack_170 * 0x80000 | (uint)uStack_170 >> 0xd) ^
         ((uint)uStack_170 * 0x40000000 | (uint)uStack_170 >> 2)) + iVar5;
    iVar5 = (uint)local_178 + K[lVar4] + auStack_158[lVar4 + 8] +
            (((uint)uStack_160 ^ uStack_160._4_4_) & local_168._4_4_ ^ uStack_160._4_4_) +
            ((local_168._4_4_ * 0x80 | local_168._4_4_ >> 0x19) ^
            (local_168._4_4_ * 0x200000 | local_168._4_4_ >> 0xb) ^
            (local_168._4_4_ * 0x4000000 | local_168._4_4_ >> 6));
    local_168._0_4_ = (uint)local_168 + iVar5;
    local_178._0_4_ =
         ((local_178._4_4_ | (uint)uStack_170) & uStack_170._4_4_ |
         local_178._4_4_ & (uint)uStack_170) +
         ((local_178._4_4_ * 0x400 | local_178._4_4_ >> 0x16) ^
         (local_178._4_4_ * 0x80000 | local_178._4_4_ >> 0xd) ^
         (local_178._4_4_ * 0x40000000 | local_178._4_4_ >> 2)) + iVar5;
    lVar4 = lVar4 + 8;
  } while (lVar4 == 0xf);
  uVar10 = 0x10;
  do {
    uVar8 = auStack_158[uVar10 + 6];
    uVar1 = *(uint *)((long)&local_178 + uVar10 * 4 + 4);
    uVar7 = *(uint *)((long)&uStack_170 + uVar10 * 4);
    uVar6 = (uVar8 >> 10 ^ (uVar8 << 0xd | uVar8 >> 0x13) ^ (uVar8 << 0xf | uVar8 >> 0x11)) +
            auStack_158[uVar10 + 1] + *(int *)((long)&local_178 + uVar10 * 4) +
            (uVar1 >> 3 ^ (uVar1 << 0xe | uVar1 >> 0x12) ^ (uVar1 << 0x19 | uVar1 >> 7));
    uVar2 = K[uVar10];
    auStack_158[uVar10 + 8] = uVar6;
    iVar5 = (((uint)local_168 << 7 | (uint)local_168 >> 0x19) ^
            ((uint)local_168 << 0x15 | (uint)local_168 >> 0xb) ^
            ((uint)local_168 << 0x1a | (uint)local_168 >> 6)) + uStack_160._4_4_ + uVar2 +
            ((local_168._4_4_ ^ (uint)uStack_160) & (uint)local_168 ^ (uint)uStack_160) + uVar6;
    uStack_170._4_4_ = uStack_170._4_4_ + iVar5;
    uStack_160._4_4_ =
         ((local_178._4_4_ | (uint)local_178) & (uint)uStack_170 | local_178._4_4_ & (uint)local_178
         ) + (((uint)local_178 << 10 | (uint)local_178 >> 0x16) ^
             ((uint)local_178 << 0x13 | (uint)local_178 >> 0xd) ^
             ((uint)local_178 << 0x1e | (uint)local_178 >> 2)) + iVar5;
    uVar8 = auStack_158[uVar10 + 7];
    uVar9 = uVar1 + auStack_158[uVar10 + 2] +
            (uVar8 >> 10 ^ (uVar8 << 0xd | uVar8 >> 0x13) ^ (uVar8 << 0xf | uVar8 >> 0x11)) +
            (uVar7 >> 3 ^ (uVar7 << 0xe | uVar7 >> 0x12) ^ (uVar7 << 0x19 | uVar7 >> 7));
    uVar2 = K[uVar10 + 1];
    auStack_158[uVar10 + 9] = uVar9;
    iVar5 = ((uStack_170._4_4_ * 0x80 | uStack_170._4_4_ >> 0x19) ^
            (uStack_170._4_4_ * 0x200000 | uStack_170._4_4_ >> 0xb) ^
            (uStack_170._4_4_ * 0x4000000 | uStack_170._4_4_ >> 6)) + uVar9 +
            ((local_168._4_4_ ^ (uint)local_168) & uStack_170._4_4_ ^ local_168._4_4_) +
            (uint)uStack_160 + uVar2;
    uStack_170._0_4_ = (uint)uStack_170 + iVar5;
    uStack_160._0_4_ =
         ((uStack_160._4_4_ | (uint)local_178) & local_178._4_4_ |
         uStack_160._4_4_ & (uint)local_178) +
         ((uStack_160._4_4_ * 0x400 | uStack_160._4_4_ >> 0x16) ^
         (uStack_160._4_4_ * 0x80000 | uStack_160._4_4_ >> 0xd) ^
         (uStack_160._4_4_ * 0x40000000 | uStack_160._4_4_ >> 2)) + iVar5;
    uVar8 = *(uint *)((long)&uStack_170 + uVar10 * 4 + 4);
    uVar7 = (uVar6 >> 10 ^ (uVar6 * 0x2000 | uVar6 >> 0x13) ^ (uVar6 * 0x8000 | uVar6 >> 0x11)) +
            uVar7 + auStack_158[uVar10 + 3] +
            (uVar8 >> 3 ^ (uVar8 << 0xe | uVar8 >> 0x12) ^ (uVar8 << 0x19 | uVar8 >> 7));
    uVar2 = K[uVar10 + 2];
    auStack_158[uVar10 + 10] = uVar7;
    iVar5 = local_168._4_4_ + uVar2 +
            ((uStack_170._4_4_ ^ (uint)local_168) & (uint)uStack_170 ^ (uint)local_168) + uVar7 +
            (((uint)uStack_170 * 0x80 | (uint)uStack_170 >> 0x19) ^
            ((uint)uStack_170 * 0x200000 | (uint)uStack_170 >> 0xb) ^
            ((uint)uStack_170 * 0x4000000 | (uint)uStack_170 >> 6));
    local_178._4_4_ = local_178._4_4_ + iVar5;
    local_168._4_4_ =
         iVar5 + (((uint)uStack_160 | uStack_160._4_4_) & (uint)local_178 |
                 (uint)uStack_160 & uStack_160._4_4_) +
                 (((uint)uStack_160 * 0x400 | (uint)uStack_160 >> 0x16) ^
                 ((uint)uStack_160 * 0x80000 | (uint)uStack_160 >> 0xd) ^
                 ((uint)uStack_160 * 0x40000000 | (uint)uStack_160 >> 2));
    uVar1 = *(uint *)((long)&local_168 + uVar10 * 4);
    uVar11 = (uVar9 >> 10 ^ (uVar9 * 0x2000 | uVar9 >> 0x13) ^ (uVar9 * 0x8000 | uVar9 >> 0x11)) +
             uVar8 + auStack_158[uVar10 + 4] +
             (uVar1 >> 3 ^ (uVar1 << 0xe | uVar1 >> 0x12) ^ (uVar1 << 0x19 | uVar1 >> 7));
    auStack_158[uVar10 + 0xb] = uVar11;
    iVar5 = (uint)local_168 + K[uVar10 + 3] + uVar11 +
            (((uint)uStack_170 ^ uStack_170._4_4_) & local_178._4_4_ ^ uStack_170._4_4_) +
            ((local_178._4_4_ * 0x80 | local_178._4_4_ >> 0x19) ^
            (local_178._4_4_ * 0x200000 | local_178._4_4_ >> 0xb) ^
            (local_178._4_4_ * 0x4000000 | local_178._4_4_ >> 6));
    local_178._0_4_ = (uint)local_178 + iVar5;
    local_168._0_4_ =
         iVar5 + ((local_168._4_4_ | (uint)uStack_160) & uStack_160._4_4_ |
                 local_168._4_4_ & (uint)uStack_160) +
                 ((local_168._4_4_ * 0x400 | local_168._4_4_ >> 0x16) ^
                 (local_168._4_4_ * 0x80000 | local_168._4_4_ >> 0xd) ^
                 (local_168._4_4_ * 0x40000000 | local_168._4_4_ >> 2));
    uVar8 = *(uint *)((long)&local_168 + uVar10 * 4 + 4);
    uVar9 = (uVar7 >> 10 ^ (uVar7 * 0x2000 | uVar7 >> 0x13) ^ (uVar7 * 0x8000 | uVar7 >> 0x11)) +
            uVar1 + auStack_158[uVar10 + 5] +
            (uVar8 >> 3 ^ (uVar8 << 0xe | uVar8 >> 0x12) ^ (uVar8 << 0x19 | uVar8 >> 7));
    auStack_158[uVar10 + 0xc] = uVar9;
    iVar5 = uStack_170._4_4_ + K[uVar10 + 4] + uVar9 +
            ((local_178._4_4_ ^ (uint)uStack_170) & (uint)local_178 ^ (uint)uStack_170) +
            (((uint)local_178 * 0x80 | (uint)local_178 >> 0x19) ^
            ((uint)local_178 * 0x200000 | (uint)local_178 >> 0xb) ^
            ((uint)local_178 * 0x4000000 | (uint)local_178 >> 6));
    uStack_160._4_4_ = uStack_160._4_4_ + iVar5;
    uStack_170._4_4_ =
         (((uint)local_168 | local_168._4_4_) & (uint)uStack_160 | (uint)local_168 & local_168._4_4_
         ) + (((uint)local_168 * 0x400 | (uint)local_168 >> 0x16) ^
             ((uint)local_168 * 0x80000 | (uint)local_168 >> 0xd) ^
             ((uint)local_168 * 0x40000000 | (uint)local_168 >> 2)) + iVar5;
    uVar1 = auStack_158[uVar10 - 2];
    uVar7 = auStack_158[uVar10 - 1];
    uVar11 = (uVar11 >> 10 ^ (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11)
             ) + uVar8 + auStack_158[uVar10 + 6] +
             (uVar1 >> 3 ^ (uVar1 << 0xe | uVar1 >> 0x12) ^ (uVar1 << 0x19 | uVar1 >> 7));
    iVar5 = (uint)uStack_170 + K[uVar10 + 5] + uVar11 +
            (((uint)local_178 ^ local_178._4_4_) & uStack_160._4_4_ ^ local_178._4_4_) +
            ((uStack_160._4_4_ * 0x80 | uStack_160._4_4_ >> 0x19) ^
            (uStack_160._4_4_ * 0x200000 | uStack_160._4_4_ >> 0xb) ^
            (uStack_160._4_4_ * 0x4000000 | uStack_160._4_4_ >> 6));
    uStack_160._0_4_ = (uint)uStack_160 + iVar5;
    uStack_170._0_4_ =
         ((uStack_170._4_4_ | (uint)local_168) & local_168._4_4_ |
         uStack_170._4_4_ & (uint)local_168) +
         ((uStack_170._4_4_ * 0x400 | uStack_170._4_4_ >> 0x16) ^
         (uStack_170._4_4_ * 0x80000 | uStack_170._4_4_ >> 0xd) ^
         (uStack_170._4_4_ * 0x40000000 | uStack_170._4_4_ >> 2)) + iVar5;
    auStack_158[uVar10 + 0xd] = uVar11;
    uVar8 = (uVar9 >> 10 ^ (uVar9 * 0x2000 | uVar9 >> 0x13) ^ (uVar9 * 0x8000 | uVar9 >> 0x11)) +
            uVar1 + auStack_158[uVar10 + 7] +
            (uVar7 >> 3 ^ (uVar7 << 0xe | uVar7 >> 0x12) ^ (uVar7 << 0x19 | uVar7 >> 7));
    auStack_158[uVar10 + 0xe] = uVar8;
    iVar5 = local_178._4_4_ + K[uVar10 + 6] + uVar8 +
            ((uStack_160._4_4_ ^ (uint)local_178) & (uint)uStack_160 ^ (uint)local_178) +
            (((uint)uStack_160 * 0x80 | (uint)uStack_160 >> 0x19) ^
            ((uint)uStack_160 * 0x200000 | (uint)uStack_160 >> 0xb) ^
            ((uint)uStack_160 * 0x4000000 | (uint)uStack_160 >> 6));
    local_168._4_4_ = local_168._4_4_ + iVar5;
    local_178._4_4_ =
         (((uint)uStack_170 | uStack_170._4_4_) & (uint)local_168 |
         (uint)uStack_170 & uStack_170._4_4_) +
         (((uint)uStack_170 * 0x400 | (uint)uStack_170 >> 0x16) ^
         ((uint)uStack_170 * 0x80000 | (uint)uStack_170 >> 0xd) ^
         ((uint)uStack_170 * 0x40000000 | (uint)uStack_170 >> 2)) + iVar5;
    uVar8 = auStack_158[uVar10];
    uVar8 = uVar6 + uVar7 +
            (uVar8 >> 3 ^ (uVar8 << 0xe | uVar8 >> 0x12) ^ (uVar8 << 0x19 | uVar8 >> 7)) +
            (uVar11 >> 10 ^ (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11))
    ;
    uVar2 = K[uVar10 + 7];
    auStack_158[uVar10 + 0xf] = uVar8;
    iVar5 = (uint)local_178 + uVar2 + uVar8 +
            (((uint)uStack_160 ^ uStack_160._4_4_) & local_168._4_4_ ^ uStack_160._4_4_) +
            ((local_168._4_4_ * 0x80 | local_168._4_4_ >> 0x19) ^
            (local_168._4_4_ * 0x200000 | local_168._4_4_ >> 0xb) ^
            (local_168._4_4_ * 0x4000000 | local_168._4_4_ >> 6));
    local_168._0_4_ = (uint)local_168 + iVar5;
    local_178._0_4_ =
         ((local_178._4_4_ | (uint)uStack_170) & uStack_170._4_4_ |
         local_178._4_4_ & (uint)uStack_170) +
         ((local_178._4_4_ * 0x400 | local_178._4_4_ >> 0x16) ^
         (local_178._4_4_ * 0x80000 | local_178._4_4_ >> 0xd) ^
         (local_178._4_4_ * 0x40000000 | local_178._4_4_ >> 2)) + iVar5;
    bVar12 = uVar10 < 0x38;
    uVar10 = uVar10 + 8;
  } while (bVar12);
  lVar4 = 0;
  do {
    ctx->state[lVar4] = ctx->state[lVar4] + *(int *)((long)&local_178 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  return;
}

Assistant:

void mbedtls_sha256_process( mbedtls_sha256_context *ctx, const unsigned char data[64] )
{
    uint32_t temp1, temp2, W[64];
    uint32_t A[8];
    unsigned int i;

    for( i = 0; i < 8; i++ )
        A[i] = ctx->state[i];

#if defined(MBEDTLS_SHA256_SMALLER)
    for( i = 0; i < 64; i++ )
    {
        if( i < 16 )
            GET_UINT32_BE( W[i], data, 4 * i );
        else
            R( i );

        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i], K[i] );

        temp1 = A[7]; A[7] = A[6]; A[6] = A[5]; A[5] = A[4]; A[4] = A[3];
        A[3] = A[2]; A[2] = A[1]; A[1] = A[0]; A[0] = temp1;
    }
#else /* MBEDTLS_SHA256_SMALLER */
    for( i = 0; i < 16; i++ )
        GET_UINT32_BE( W[i], data, 4 * i );

    for( i = 0; i < 16; i += 8 )
    {
        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i+0], K[i+0] );
        P( A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], W[i+1], K[i+1] );
        P( A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], W[i+2], K[i+2] );
        P( A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], W[i+3], K[i+3] );
        P( A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], W[i+4], K[i+4] );
        P( A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], W[i+5], K[i+5] );
        P( A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], W[i+6], K[i+6] );
        P( A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], W[i+7], K[i+7] );
    }

    for( i = 16; i < 64; i += 8 )
    {
        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], R(i+0), K[i+0] );
        P( A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], R(i+1), K[i+1] );
        P( A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], R(i+2), K[i+2] );
        P( A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], R(i+3), K[i+3] );
        P( A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], R(i+4), K[i+4] );
        P( A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], R(i+5), K[i+5] );
        P( A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], R(i+6), K[i+6] );
        P( A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], R(i+7), K[i+7] );
    }
#endif /* MBEDTLS_SHA256_SMALLER */

    for( i = 0; i < 8; i++ )
        ctx->state[i] += A[i];
}